

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O1

void bitrv216(double *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar1 = a[2];
  dVar2 = a[3];
  dVar3 = a[4];
  dVar4 = a[5];
  dVar5 = a[6];
  dVar6 = a[7];
  dVar7 = a[10];
  dVar8 = a[0xb];
  dVar9 = a[0xe];
  dVar10 = a[0xf];
  dVar11 = a[0x16];
  dVar12 = a[0x17];
  a[2] = a[0x10];
  a[3] = a[0x11];
  a[4] = a[8];
  a[5] = a[9];
  a[6] = a[0x18];
  a[7] = a[0x19];
  a[8] = dVar3;
  a[9] = dVar4;
  a[10] = a[0x14];
  a[0xb] = a[0x15];
  a[0xe] = a[0x1c];
  a[0xf] = a[0x1d];
  a[0x10] = dVar1;
  a[0x11] = dVar2;
  a[0x14] = dVar7;
  a[0x15] = dVar8;
  a[0x16] = a[0x1a];
  a[0x17] = a[0x1b];
  a[0x18] = dVar5;
  a[0x19] = dVar6;
  a[0x1a] = dVar11;
  a[0x1b] = dVar12;
  a[0x1c] = dVar9;
  a[0x1d] = dVar10;
  return;
}

Assistant:

void bitrv216(double *a) {
  double x1r, x1i, x2r, x2i, x3r, x3i, x4r, x4i,
    x5r, x5i, x7r, x7i, x8r, x8i, x10r, x10i,
    x11r, x11i, x12r, x12i, x13r, x13i, x14r, x14i;

  x1r = a[2];
  x1i = a[3];
  x2r = a[4];
  x2i = a[5];
  x3r = a[6];
  x3i = a[7];
  x4r = a[8];
  x4i = a[9];
  x5r = a[10];
  x5i = a[11];
  x7r = a[14];
  x7i = a[15];
  x8r = a[16];
  x8i = a[17];
  x10r = a[20];
  x10i = a[21];
  x11r = a[22];
  x11i = a[23];
  x12r = a[24];
  x12i = a[25];
  x13r = a[26];
  x13i = a[27];
  x14r = a[28];
  x14i = a[29];
  a[2] = x8r;
  a[3] = x8i;
  a[4] = x4r;
  a[5] = x4i;
  a[6] = x12r;
  a[7] = x12i;
  a[8] = x2r;
  a[9] = x2i;
  a[10] = x10r;
  a[11] = x10i;
  a[14] = x14r;
  a[15] = x14i;
  a[16] = x1r;
  a[17] = x1i;
  a[20] = x5r;
  a[21] = x5i;
  a[22] = x13r;
  a[23] = x13i;
  a[24] = x3r;
  a[25] = x3i;
  a[26] = x11r;
  a[27] = x11i;
  a[28] = x7r;
  a[29] = x7i;
}